

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

Token * __thiscall Tokenizer::parseNumber(Token *__return_storage_ptr__,Tokenizer *this,char c)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_f8;
  variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_d0;
  _Optional_payload_base<char> local_a2;
  variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_a0;
  _Optional_payload_base<char> local_72;
  double local_70;
  double mult;
  variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_58;
  _Optional_payload_base<char> local_2a;
  double local_28;
  double res;
  optional<char> _;
  Tokenizer *pTStack_18;
  char c_local;
  Tokenizer *this_local;
  
  res._7_1_ = c;
  pTStack_18 = this;
  std::optional<char>::optional((optional<char> *)((long)&res + 5));
  local_28 = 0.0;
  while (iVar2 = isdigit((int)res._7_1_), iVar2 != 0) {
    local_28 = (double)(res._7_1_ + -0x30) + local_28 * 10.0;
    local_2a = (_Optional_payload_base<char>)next(this);
    res._5_2_ = local_2a;
    bVar1 = std::optional<char>::has_value((optional<char> *)((long)&res + 5));
    if (!bVar1) {
      std::variant<int,double,std::__cxx11::string,bool,char>::
      variant<double&,void,void,double,void>
                ((variant<int,double,std::__cxx11::string,bool,char> *)&local_58,&local_28);
      Token::Token(__return_storage_ptr__,Number,(tokenValue *)&local_58);
      std::
      variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
      ::~variant(&local_58);
      return __return_storage_ptr__;
    }
    pcVar3 = std::optional<char>::value((optional<char> *)((long)&res + 5));
    res._7_1_ = *pcVar3;
  }
  if (res._7_1_ == '.') {
    local_70 = 0.1;
    local_72 = (_Optional_payload_base<char>)next(this);
    res._5_2_ = local_72;
    bVar1 = std::optional<char>::has_value((optional<char> *)((long)&res + 5));
    if (!bVar1) {
      std::variant<int,double,std::__cxx11::string,bool,char>::
      variant<double&,void,void,double,void>
                ((variant<int,double,std::__cxx11::string,bool,char> *)&local_a0,&local_28);
      Token::Token(__return_storage_ptr__,Number,(tokenValue *)&local_a0);
      std::
      variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
      ::~variant(&local_a0);
      return __return_storage_ptr__;
    }
    pcVar3 = std::optional<char>::value((optional<char> *)((long)&res + 5));
    res._7_1_ = *pcVar3;
    while (iVar2 = isdigit((int)res._7_1_), iVar2 != 0) {
      local_28 = (double)(res._7_1_ + -0x30) * local_70 + local_28;
      local_70 = local_70 * 0.1;
      local_a2 = (_Optional_payload_base<char>)next(this);
      res._5_2_ = local_a2;
      bVar1 = std::optional<char>::has_value((optional<char> *)((long)&res + 5));
      if (!bVar1) {
        std::variant<int,double,std::__cxx11::string,bool,char>::
        variant<double&,void,void,double,void>
                  ((variant<int,double,std::__cxx11::string,bool,char> *)&local_d0,&local_28);
        Token::Token(__return_storage_ptr__,Number,(tokenValue *)&local_d0);
        std::
        variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
        ::~variant(&local_d0);
        return __return_storage_ptr__;
      }
      pcVar3 = std::optional<char>::value((optional<char> *)((long)&res + 5));
      res._7_1_ = *pcVar3;
    }
  }
  std::variant<int,double,std::__cxx11::string,bool,char>::variant<double&,void,void,double,void>
            ((variant<int,double,std::__cxx11::string,bool,char> *)&local_f8,&local_28);
  Token::Token(__return_storage_ptr__,Number,(tokenValue *)&local_f8);
  std::
  variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  ::~variant(&local_f8);
  return __return_storage_ptr__;
}

Assistant:

Token Tokenizer::parseNumber(char c) {
    optional<char> _;
    double res = 0;
    while (isdigit(c)) {
        res *= 10;
        res += c - '0';

        _ = next();
        if (!_.has_value()) {
            return Token(Number, res);
        }
        c = _.value();
    }
    if (c == '.') {
        double mult = 0.1;
        _ = next();
        if (!_.has_value()) {
            return Token(Number, res);
        }
        c = _.value();
        while (isdigit(c)) {
            res += (c - '0') * mult;
            mult *= 0.1;
            _ = next();
            if (!_.has_value()) {
                return Token(Number, res);
            }
            c = _.value();
        }
    }
    return Token(Number, res);
}